

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O3

uint32_t predict_bandit_adf(warm_cb *data,multi_learner *base,example *ec)

{
  uint64_t *puVar1;
  pointer ppeVar2;
  example *peVar3;
  size_t sVar4;
  action_score *_begin;
  int iVar5;
  pointer ppeVar6;
  vw_exception *this;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  multi_ex *__range1;
  float fVar10;
  uint32_t chosen_action;
  stringstream __msg;
  uint32_t local_1fc;
  string local_1f8;
  pointer_____offset_0x10___ *local_1d8;
  float *local_1d0;
  vector<float,_std::allocator<float>_> local_1c8;
  pointer_____offset_0x10___ *local_1b0;
  float *local_1a8;
  ostream local_1a0;
  
  std::vector<float,_std::allocator<float>_>::vector(&local_1c8,&data->cumulative_costs);
  if ((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    iVar9 = 0;
    iVar5 = 0;
    if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) goto LAB_0020a491;
  }
  else {
    fVar10 = 3.4028235e+38;
    uVar7 = 0;
    uVar8 = 0;
    do {
      if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] < fVar10) {
        uVar8 = uVar7 & 0xffffffff;
        fVar10 = local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
      }
      uVar7 = uVar7 + 1;
      iVar5 = (int)uVar8;
    } while ((uVar7 & 0xffffffff) <
             (ulong)((long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  iVar9 = iVar5;
  operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_0020a491:
  copy_example_to_adf(data,ec);
  ppeVar6 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar6 != ppeVar2) {
    iVar5 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar6)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(uint)(iVar5 * iVar9);
      ppeVar6 = ppeVar6 + 1;
    } while (ppeVar6 != ppeVar2);
  }
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),&data->ecs);
  ppeVar6 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar6 != ppeVar2) {
    iVar5 = *(int *)(base + 0xe0);
    do {
      puVar1 = &((*ppeVar6)->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uint)(iVar9 * iVar5);
      ppeVar6 = ppeVar6 + 1;
    } while (ppeVar6 != ppeVar2);
    ppeVar6 = (data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  peVar3 = *ppeVar6;
  sVar4 = data->example_counter;
  data->example_counter = sVar4 + 1;
  local_1a8 = (peVar3->pred).scalars._begin;
  local_1d0 = (peVar3->pred).scalars._end;
  local_1b0 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_1d8 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  iVar5 = exploration::sample_after_normalizing<ACTION_SCORE::score_iterator>
                    (sVar4 + data->app_seed,&local_1b0,&local_1d8,&local_1fc);
  if (iVar5 == 0) {
    v_array<ACTION_SCORE::action_score>::clear(&data->a_s_adf);
    _begin = (peVar3->pred).a_s._begin;
    push_many<ACTION_SCORE::action_score>
              (&data->a_s_adf,_begin,(long)(peVar3->pred).scalars._end - (long)_begin >> 3);
    return local_1fc;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a0,"Failed to sample from pdf",0x19);
  this = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/warm_cb.cc"
             ,0x19f,&local_1f8);
  __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

uint32_t predict_bandit_adf(warm_cb& data, multi_learner& base, example& ec)
{
	uint32_t argmin = find_min(data.cumulative_costs);

  copy_example_to_adf(data, ec);
	base.predict(data.ecs, argmin);

	auto& out_ec = *data.ecs[0];
  uint32_t chosen_action;
  if (sample_after_normalizing(data.app_seed + data.example_counter++, begin_scores(out_ec.pred.a_s), end_scores(out_ec.pred.a_s), chosen_action))
    THROW("Failed to sample from pdf");

	auto& a_s = data.a_s_adf;
	copy_array<action_score>(a_s, out_ec.pred.a_s);

	return chosen_action;
}